

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint64_t absl::lts_20250127::hash_internal::MixingHashState::Read4To8(uchar *p,size_t len)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t least_significant;
  uint64_t most_significant;
  size_t len_local;
  uchar *p_local;
  
  uVar1 = base_internal::UnalignedLoad32(p);
  uVar2 = base_internal::UnalignedLoad32(p + (len - 4));
  return CONCAT44(uVar1,uVar2);
}

Assistant:

static uint64_t Read4To8(const unsigned char* p, size_t len) {
    // If `len < 8`, we duplicate bytes in the middle.
    // E.g.:
    // `ABCD` will be read as `ABCDABCD`.
    // `ABCDE` will be read as `ABCDBCDE`.
    // `ABCDEF` will be read as `ABCDCDEF`.
    // `ABCDEFG` will be read as `ABCDDEFG`.
    // We also do not care about endianness. On big-endian platforms, bytes will
    // be shuffled (it's fine). We always shift low memory by 32, because that
    // can be pipelined earlier. Reading high memory requires computing
    // `p + len - 4`.
    uint64_t most_significant =
        static_cast<uint64_t>(absl::base_internal::UnalignedLoad32(p)) << 32;
    uint64_t least_significant =
        absl::base_internal::UnalignedLoad32(p + len - 4);
    return most_significant | least_significant;
  }